

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O0

void __thiscall
ZXing::Pdf417::ModulusPoly::divide
          (ModulusPoly *this,ModulusPoly *other,ModulusPoly *quotient,ModulusPoly *remainder)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  invalid_argument *piVar6;
  long *in_RSI;
  long *in_RDI;
  ModulusPoly iterationQuotient;
  ModulusPoly term;
  int scale;
  int degreeDifference;
  int inverseDenominatorLeadingTerm;
  int denominatorLeadingTerm;
  ModulusPoly *in_stack_fffffffffffffef8;
  int degree;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  long lVar7;
  uint in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff28;
  ModulusGF *in_stack_ffffffffffffff30;
  ModulusPoly *in_stack_ffffffffffffff50;
  ModulusPoly *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  ModulusGF *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  ModulusPoly *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffc0;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (*in_RDI != *in_RSI) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"ModulusPolys do not have same ModulusGF field");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = isZero((ModulusPoly *)0x2cb78f);
  if (!bVar1) {
    ModulusGF::zero((ModulusGF *)*in_RDI);
    operator=((ModulusPoly *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              in_stack_fffffffffffffef8);
    operator=((ModulusPoly *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              in_stack_fffffffffffffef8);
    ModulusPoly::degree((ModulusPoly *)0x2cb83c);
    coefficient((ModulusPoly *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    iVar2 = ModulusGF::inverse(in_stack_ffffffffffffff30,iVar2);
    while( true ) {
      degree = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      iVar3 = ModulusPoly::degree((ModulusPoly *)0x2cb879);
      iVar4 = ModulusPoly::degree((ModulusPoly *)0x2cb88a);
      in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c & 0xffffff;
      if (iVar4 <= iVar3) {
        bVar1 = isZero((ModulusPoly *)0x2cb8a7);
        in_stack_ffffffffffffff1c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff1c) ^ 0xff000000;
      }
      if ((in_stack_ffffffffffffff1c & 0x1000000) == 0) break;
      iVar4 = ModulusPoly::degree((ModulusPoly *)0x2cb8c7);
      iVar5 = ModulusPoly::degree((ModulusPoly *)0x2cb8d8);
      iVar5 = iVar4 - iVar5;
      lVar7 = *in_RDI;
      ModulusPoly::degree((ModulusPoly *)0x2cb906);
      coefficient((ModulusPoly *)CONCAT44(iVar4,in_stack_ffffffffffffff00),degree);
      iVar3 = ModulusGF::multiply((ModulusGF *)CONCAT44(in_stack_ffffffffffffff1c,iVar3),
                                  (int)((ulong)lVar7 >> 0x20),(int)lVar7);
      multiplyByMonomial(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                         in_stack_ffffffffffffff70);
      ModulusGF::buildMonomial
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      add((ModulusPoly *)CONCAT44(iVar2,iVar5),
          (ModulusPoly *)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
      in_stack_fffffffffffffef8 = (ModulusPoly *)&stack0xffffffffffffff60;
      operator=((ModulusPoly *)CONCAT44(iVar4,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
      ~ModulusPoly((ModulusPoly *)0x2cb9af);
      subtract(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      operator=((ModulusPoly *)CONCAT44(iVar4,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
      ~ModulusPoly((ModulusPoly *)0x2cb9e7);
      ~ModulusPoly((ModulusPoly *)0x2cb9f4);
      ~ModulusPoly((ModulusPoly *)0x2cba01);
    }
    return;
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"Divide by 0");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
ModulusPoly::divide(const ModulusPoly& other, ModulusPoly& quotient, ModulusPoly& remainder) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (other.isZero()) {
		throw std::invalid_argument("Divide by 0");
	}

	quotient = _field->zero();
	remainder = *this;

	int denominatorLeadingTerm = other.coefficient(other.degree());
	int inverseDenominatorLeadingTerm = _field->inverse(denominatorLeadingTerm);

	while (remainder.degree() >= other.degree() && !remainder.isZero()) {
		int degreeDifference = remainder.degree() - other.degree();
		int scale = _field->multiply(remainder.coefficient(remainder.degree()), inverseDenominatorLeadingTerm);
		ModulusPoly term = other.multiplyByMonomial(degreeDifference, scale);
		ModulusPoly iterationQuotient = _field->buildMonomial(degreeDifference, scale);
		quotient = quotient.add(iterationQuotient);
		remainder = remainder.subtract(term);
	}
}